

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<test_result_(fmt::v5::monostate)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(fmt::v5::monostate)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001bb978;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_.value_ =
       (MatcherInterface<fmt::v5::monostate> *)0x0;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_.link_;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<fmt::v5::monostate>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001bb9c8;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}